

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t driver::zesRasSetConfig(zes_ras_handle_t hRas,zes_ras_config_t *pConfig)

{
  zes_pfnRasSetConfig_t pfnSetConfig;
  ze_result_t result;
  zes_ras_config_t *pConfig_local;
  zes_ras_handle_t hRas_local;
  
  pfnSetConfig._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cde0 != (code *)0x0) {
    pfnSetConfig._4_4_ = (*DAT_0011cde0)(hRas,pConfig);
  }
  return pfnSetConfig._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesRasSetConfig(
        zes_ras_handle_t hRas,                          ///< [in] Handle for the component.
        const zes_ras_config_t* pConfig                 ///< [in] Change the RAS configuration - thresholds used to trigger events
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnSetConfig = context.zesDdiTable.Ras.pfnSetConfig;
        if( nullptr != pfnSetConfig )
        {
            result = pfnSetConfig( hRas, pConfig );
        }
        else
        {
            // generic implementation
        }

        return result;
    }